

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O0

uint256 * ComputeMerkleRoot(vector<uint256,_std::allocator<uint256>_> *hashes,bool *mutated)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  vector<uint256,_std::allocator<uint256>_> *pvVar4;
  reference pvVar5;
  undefined1 *in_RDX;
  uint256 *in_RDI;
  long in_FS_OFFSET;
  size_t pos;
  bool mutation;
  base_blob<256U> *in_stack_ffffffffffffff98;
  base_blob<256U> *in_stack_ffffffffffffffa0;
  base_blob<256U> *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb0;
  vector<uint256,_std::allocator<uint256>_> *in_stack_ffffffffffffffb8;
  long local_28;
  undefined1 local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_19 = 0;
  while (sVar3 = std::vector<uint256,_std::allocator<uint256>_>::size
                           ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff98),
        1 < sVar3) {
    if (in_RDX != (undefined1 *)0x0) {
      local_28 = 0;
      while( true ) {
        in_stack_ffffffffffffffb8 = (vector<uint256,_std::allocator<uint256>_> *)(local_28 + 1);
        pvVar4 = (vector<uint256,_std::allocator<uint256>_> *)
                 std::vector<uint256,_std::allocator<uint256>_>::size
                           ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff98);
        if (pvVar4 <= in_stack_ffffffffffffffb8) break;
        in_stack_ffffffffffffffb0 =
             std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffffa8,
                        (size_type)in_stack_ffffffffffffffa0);
        std::vector<uint256,_std::allocator<uint256>_>::operator[]
                  ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffffa8,
                   (size_type)in_stack_ffffffffffffffa0);
        bVar2 = operator==(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        if (bVar2) {
          local_19 = 1;
        }
        local_28 = local_28 + 2;
      }
    }
    sVar3 = std::vector<uint256,_std::allocator<uint256>_>::size
                      ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff98);
    if ((sVar3 & 1) != 0) {
      std::vector<uint256,_std::allocator<uint256>_>::back
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff98);
      std::vector<uint256,_std::allocator<uint256>_>::push_back
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffffa8,
                 (value_type *)in_stack_ffffffffffffffa0);
    }
    std::vector<uint256,_std::allocator<uint256>_>::operator[]
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffffa8,
               (size_type)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffa0 = (base_blob<256U> *)base_blob<256U>::begin(in_stack_ffffffffffffff98)
    ;
    std::vector<uint256,_std::allocator<uint256>_>::operator[]
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffffa8,
               (size_type)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffa8 = (base_blob<256U> *)base_blob<256U>::begin(in_stack_ffffffffffffff98)
    ;
    std::vector<uint256,_std::allocator<uint256>_>::size
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff98);
    SHA256D64((uchar *)in_stack_ffffffffffffffa8,(uchar *)in_stack_ffffffffffffffa0,
              (size_t)in_stack_ffffffffffffff98);
    std::vector<uint256,_std::allocator<uint256>_>::size
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff98);
    std::vector<uint256,_std::allocator<uint256>_>::resize
              (in_stack_ffffffffffffffb8,(size_type)in_stack_ffffffffffffffb0);
  }
  if (in_RDX != (undefined1 *)0x0) {
    *in_RDX = local_19;
  }
  sVar3 = std::vector<uint256,_std::allocator<uint256>_>::size
                    ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff98);
  if (sVar3 == 0) {
    memset(in_RDI,0,0x20);
    uint256::uint256((uint256 *)in_stack_ffffffffffffff98);
  }
  else {
    pvVar5 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffffa8,
                        (size_type)in_stack_ffffffffffffffa0);
    *(undefined8 *)(in_RDI->super_base_blob<256U>).m_data._M_elems =
         *(undefined8 *)(pvVar5->super_base_blob<256U>).m_data._M_elems;
    *(undefined8 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 8) =
         *(undefined8 *)((pvVar5->super_base_blob<256U>).m_data._M_elems + 8);
    *(undefined8 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 0x10) =
         *(undefined8 *)((pvVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 0x18) =
         *(undefined8 *)((pvVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

uint256 ComputeMerkleRoot(std::vector<uint256> hashes, bool* mutated) {
    bool mutation = false;
    while (hashes.size() > 1) {
        if (mutated) {
            for (size_t pos = 0; pos + 1 < hashes.size(); pos += 2) {
                if (hashes[pos] == hashes[pos + 1]) mutation = true;
            }
        }
        if (hashes.size() & 1) {
            hashes.push_back(hashes.back());
        }
        SHA256D64(hashes[0].begin(), hashes[0].begin(), hashes.size() / 2);
        hashes.resize(hashes.size() / 2);
    }
    if (mutated) *mutated = mutation;
    if (hashes.size() == 0) return uint256();
    return hashes[0];
}